

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall TApp_SubcomInheritCaseCheck_Test::TestBody(TApp_SubcomInheritCaseCheck_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  App *pAVar2;
  char *pcVar3;
  reference ppAVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  AssertHelper local_250;
  Message local_248;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_240;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  iterator local_1e8;
  size_type local_1e0;
  AssertHelper local_1d8;
  Message local_1d0;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_1c8;
  size_type local_1b0;
  unsigned_long local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_180;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  iterator local_128;
  size_type local_120;
  AssertHelper local_118;
  Message local_110;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_108;
  size_type local_f0;
  unsigned_long local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  string local_c8;
  allocator local_a1;
  string local_a0;
  App *local_80;
  App *sub2;
  string local_70;
  allocator local_39;
  string local_38;
  App *local_18;
  App *sub1;
  TApp_SubcomInheritCaseCheck_Test *this_local;
  
  pAVar2 = &(this->super_TApp).app;
  sub1 = (App *)this;
  CLI::App::ignore_case(pAVar2,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"sub1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&sub2 + 7));
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sub2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"sub2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  pAVar2 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pAVar2;
  TApp::run(&this->super_TApp);
  local_e8 = 0;
  CLI::App::get_subcommands(&local_108,&(this->super_TApp).app,true);
  local_f0 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_108);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e0,"(size_t)0","app.get_subcommands().size()",&local_e8,
             &local_f0);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x1ff,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_1.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"SuB1",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  gtest_ar_1.message_.ptr_._6_1_ = 0;
  local_128 = &local_148;
  local_120 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_128;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128;
  do {
    local_2c8 = local_2c8 + -1;
    std::__cxx11::string::~string((string *)local_2c8);
  } while (local_2c8 != &local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  CLI::App::get_subcommands(&local_180,&(this->super_TApp).app,true);
  ppAVar4 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at(&local_180,0);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_168,"sub1","app.get_subcommands().at(0)",&local_18,ppAVar4);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x204,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pAVar2 = &(this->super_TApp).app;
  CLI::App::reset(pAVar2);
  local_1a8 = 0;
  CLI::App::get_subcommands(&local_1c8,pAVar2,true);
  local_1b0 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_1c8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1a0,"(size_t)0","app.get_subcommands().size()",&local_1a8,
             &local_1b0);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x207,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  gtest_ar_3.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_208,"sUb2",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
  gtest_ar_3.message_.ptr_._6_1_ = 0;
  local_1e8 = &local_208;
  local_1e0 = 1;
  __l._M_len = 1;
  __l._M_array = local_1e8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8;
  do {
    local_358 = local_358 + -1;
    std::__cxx11::string::~string((string *)local_358);
  } while (local_358 != &local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  CLI::App::get_subcommands(&local_240,&(this->super_TApp).app,true);
  ppAVar4 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at(&local_240,0);
  testing::internal::EqHelper<false>::Compare<CLI::App*,CLI::App*>
            ((EqHelper<false> *)local_228,"sub2","app.get_subcommands().at(0)",&local_80,ppAVar4);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector(&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x20b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  return;
}

Assistant:

TEST_F(TApp, SubcomInheritCaseCheck) {
    app.ignore_case();
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    run();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    app.reset();
    args = {"SuB1"};
    run();
    EXPECT_EQ(sub1, app.get_subcommands().at(0));

    app.reset();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    args = {"sUb2"};
    run();
    EXPECT_EQ(sub2, app.get_subcommands().at(0));
}